

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleUsage.cpp
# Opt level: O0

void readmeExample2(void)

{
  int iVar1;
  ostream *this;
  basic_ifstream<char,_std::char_traits<char>_> *stream;
  GeneratorHole local_b73;
  anon_class_1_0_00000001 local_b72 [2];
  GeneratorHole local_b70;
  anon_class_1_0_00000001 local_b6f;
  GeneratorBuilder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:164:26)>
  local_b6e [2];
  GeneratorHole local_b6c;
  anon_class_1_0_00000001 local_b6b;
  GeneratorBuilder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:196:26)>
  local_b6a;
  GeneratorHole local_b69;
  GeneratorBuilder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
  local_b68 [3];
  LazyCode local_b50 [520];
  Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
  local_948;
  Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
  local_718;
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>
  local_4d0;
  Generator<LazyCode::Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:169:17)>
  local_278;
  int local_c;
  int total;
  
  std::ifstream::ifstream(local_b50,"test.txt",8);
  LazyCode::read<int,std::ifstream>(&local_948,local_b50,stream);
  local_b68[0].build.n =
       (anon_class_8_1_54a3980e_for_build)LazyCode::limit<LazyCode::GeneratorHole,_0>(10,&local_b69)
  ;
  LazyCode::
  operator|<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
            (&local_718,&local_948,local_b68);
  LazyCode::
  filter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_example_exampleUsage_cpp:17:28),_LazyCode::GeneratorHole,_0>
            (&local_b6b,&local_b6c);
  LazyCode::
  operator|<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:196:26)>
            (&local_4d0,&local_718,&local_b6a);
  LazyCode::
  map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_example_exampleUsage_cpp:18:25),_LazyCode::GeneratorHole,_0>
            (&local_b6f,&local_b70);
  LazyCode::
  operator|<LazyCode::Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:164:26)>
            (&local_278,&local_4d0,local_b6e);
  LazyCode::sum<LazyCode::GeneratorHole,_0>(&local_b73);
  iVar1 = LazyCode::
          operator|<LazyCode::Generator<LazyCode::Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:201:30)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:169:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicCollectors_h:66:9),_0,_0>
                    (&local_278,local_b72);
  LazyCode::
  Generator<LazyCode::Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:201:30)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:169:17)>
  ::~Generator(&local_278);
  LazyCode::
  Generator<LazyCode::Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:201:30)>
  ::~Generator(&local_4d0);
  LazyCode::
  Generator<LazyCode::Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:231:17)>
  ::~Generator(&local_718);
  LazyCode::
  Generator<Reader,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/charliewolf[P]lazyCode/include/lazyCode/basicGenerators.h:304:22)>
  ::~Generator(&local_948);
  std::ifstream::~ifstream(local_b50);
  local_c = iVar1;
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void readmeExample2() {
    int total = lz::read<int>(ifstream("test.txt")) | lz::limit(10) |
                lz::filter([](int i) { return i % 2 == 0; }) |
                lz::map([](int i) { return i * i; }) | lz::sum();

    cout << total << endl;
}